

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O0

void number_suite::test_float_zero(void)

{
  string local_1f0 [40];
  undefined4 local_1c8;
  float local_1c4;
  size_type local_1c0 [3];
  undefined1 local_1a8 [8];
  encoder_type encoder;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::detail::basic_encoder<char,24ul>::
  basic_encoder<std::__cxx11::ostringstream>
            ((basic_encoder<char,24ul> *)local_1a8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_1c4 = 0.0;
  local_1c0[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::value<float>
                           ((basic_encoder<char,_24UL> *)local_1a8,&local_1c4);
  local_1c8 = 7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(0.0f)","7",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x16e,"void number_suite::test_float_zero()",local_1c0,&local_1c8);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[8]>
            ("result.str()","\"0.00000\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x16f,"void number_suite::test_float_zero()",local_1f0,"0.00000");
  std::__cxx11::string::~string(local_1f0);
  trial::protocol::json::detail::basic_encoder<char,_24UL>::~basic_encoder
            ((basic_encoder<char,_24UL> *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_float_zero()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(0.0f), 7);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "0.00000");
}